

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall
Rml::ElementDocument::Show(ElementDocument *this,ModalFlag modal_flag,FocusFlag focus_flag)

{
  ElementDocument *current_element;
  ElementDocument *this_00;
  byte bVar1;
  ElementDocument *pEVar2;
  bool bVar3;
  allocator<char> local_89;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [4];
  
  if (modal_flag == None) {
    bVar3 = false;
  }
  else {
    if (modal_flag != Modal) goto LAB_0028d418;
    bVar3 = true;
  }
  this->modal = bVar3;
LAB_0028d418:
  bVar3 = focus_flag < 4;
  bVar1 = (byte)focus_flag & 0xf;
  Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>((Property *)local_88,Visible);
  Element::SetProperty(&this->super_Element,Visibility,(Property *)local_88);
  Property::~Property((Property *)local_88);
  UpdateDocument(this);
  if ((0xeU >> bVar1 & bVar3) != 0) {
    if ((8U >> bVar1 & bVar3) == 0) {
      this_00 = this;
      if ((bVar3 & 4U >> bVar1) != 0) {
        this_00 = (ElementDocument *)Element::GetFocusLeafNode(&this->super_Element);
      }
    }
    else {
      pEVar2 = (ElementDocument *)0x0;
      current_element = this;
      do {
        current_element =
             (ElementDocument *)FindNextTabElement(this,&current_element->super_Element,true);
        this_00 = this;
        if ((current_element == (ElementDocument *)0x0) || (current_element == pEVar2)) break;
        if (pEVar2 == (ElementDocument *)0x0) {
          pEVar2 = current_element;
        }
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_88,"autofocus",&local_89);
        bVar3 = Element::HasAttribute((Element *)current_element,(String *)local_88);
        ::std::__cxx11::string::~string((string *)local_88);
        this_00 = current_element;
      } while (!bVar3);
    }
    bVar3 = Element::Focus(&this_00->super_Element,true);
    if (this_00 != this && bVar3) {
      Element::ScrollIntoView(&this_00->super_Element,false);
    }
  }
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78[0]._M_allocated_capacity = 0;
  Element::DispatchEvent(&this->super_Element,Show,(Dictionary *)local_88);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_88);
  return;
}

Assistant:

void ElementDocument::Show(ModalFlag modal_flag, FocusFlag focus_flag)
{
	switch (modal_flag)
	{
	case ModalFlag::None: modal = false; break;
	case ModalFlag::Modal: modal = true; break;
	case ModalFlag::Keep: break;
	}

	bool focus = false;
	bool autofocus = false;
	bool focus_previous = false;

	switch (focus_flag)
	{
	case FocusFlag::None: break;
	case FocusFlag::Document: focus = true; break;
	case FocusFlag::Keep:
		focus = true;
		focus_previous = true;
		break;
	case FocusFlag::Auto:
		focus = true;
		autofocus = true;
		break;
	}

	// Set to visible and switch focus if necessary.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

	// Update the document now, otherwise the focusing methods below do not think we are visible. This is also important
	// to ensure correct layout for any event handlers, such as for focused input fields to submit the proper caret
	// position.
	UpdateDocument();

	if (focus)
	{
		Element* focus_element = this;

		if (autofocus)
		{
			Element* first_element = nullptr;
			Element* element = FindNextTabElement(this, true);

			while (element && element != first_element)
			{
				if (!first_element)
					first_element = element;

				if (element->HasAttribute("autofocus"))
				{
					focus_element = element;
					break;
				}

				element = FindNextTabElement(element, true);
			}
		}
		else if (focus_previous)
		{
			focus_element = GetFocusLeafNode();
		}

		// Focus the window or element
		bool focused = focus_element->Focus(true);
		if (focused && focus_element != this)
			focus_element->ScrollIntoView(false);
	}

	DispatchEvent(EventId::Show, Dictionary());
}